

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects-info.c
# Opt level: O3

effect * effect_next(effect *effect)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  effect *e;
  
  if ((effect->index == 0x6c) || (effect->index == 1)) {
    iVar3 = 1;
    iVar2 = dice_evaluate(effect->dice,0,AVERAGE,(random_value *)0x0);
    if (0 < iVar2) {
      iVar3 = dice_evaluate(effect->dice,0,AVERAGE,(random_value *)0x0);
      iVar3 = iVar3 + 1;
    }
    if (0 < iVar3) {
      iVar2 = 1;
      do {
        effect = effect->next;
        if (effect == (effect *)0x0) {
          return (effect *)0x0;
        }
        bVar1 = iVar2 < iVar3;
        iVar2 = iVar2 + 1;
      } while (bVar1);
    }
  }
  else {
    effect = effect->next;
  }
  return effect;
}

Assistant:

struct effect *effect_next(struct effect *effect)
{
	if (effect->index == EF_RANDOM || effect->index == EF_SELECT) {
		struct effect *e = effect;
		int num_subeffects = MAX(0,
			dice_evaluate(effect->dice, 0, AVERAGE, NULL));
		// Skip all the sub-effects, plus one to advance beyond current
		for (int i = 0; e != NULL && i < num_subeffects + 1; i++) {
			e = e->next;
		}
		return e;
	} else {
		return effect->next;
	}
}